

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipc.c
# Opt level: O2

pchar * p_ipc_get_platform_key(pchar *name,pboolean posix)

{
  PCryptoHash *hash;
  size_t sVar1;
  pchar *__s;
  char *__dest;
  pchar *__s_00;
  size_t sVar2;
  
  if ((name == (pchar *)0x0) ||
     (hash = p_crypto_hash_new(P_CRYPTO_HASH_TYPE_SHA1), hash == (PCryptoHash *)0x0)) {
    return (pchar *)0x0;
  }
  sVar1 = strlen(name);
  p_crypto_hash_update(hash,(puchar *)name,sVar1);
  __s = p_crypto_hash_get_string(hash);
  p_crypto_hash_free(hash);
  if (__s == (pchar *)0x0) {
    return (pchar *)0x0;
  }
  if (posix == 0) {
    __s_00 = p_ipc_unix_get_temp_dir();
    sVar1 = strlen(__s_00);
    sVar2 = strlen(__s);
    __dest = (char *)p_malloc0(sVar1 + sVar2 + 1);
    if (__dest != (char *)0x0) {
      strcpy(__dest,__s_00);
      strcat(__dest,__s);
      p_free(__s_00);
      goto LAB_00114bd6;
    }
    p_free(__s_00);
  }
  else {
    __dest = (char *)p_malloc0(0xf);
    if (__dest != (char *)0x0) {
      __dest[0] = '/';
      __dest[1] = '\0';
      strncat(__dest,__s,0xd);
      goto LAB_00114bd6;
    }
  }
  __dest = (char *)0x0;
LAB_00114bd6:
  p_free(__s);
  return __dest;
}

Assistant:

pchar *
p_ipc_get_platform_key (const pchar *name, pboolean posix)
{
	PCryptoHash	*sha1;
	pchar		*hash_str;

#if defined (P_OS_WIN) || defined (P_OS_OS2) || defined (P_OS_AMIGA)
	P_UNUSED (posix);
#else
	pchar		*path_name, *tmp_path;
#endif

	if (P_UNLIKELY (name == NULL))
		return NULL;

	if (P_UNLIKELY ((sha1 = p_crypto_hash_new (P_CRYPTO_HASH_TYPE_SHA1)) == NULL))
		return NULL;

	p_crypto_hash_update (sha1, (const puchar *) name, strlen (name));

	hash_str = p_crypto_hash_get_string (sha1);
	p_crypto_hash_free (sha1);

	if (P_UNLIKELY (hash_str == NULL))
		return NULL;

#if defined (P_OS_WIN) || defined (P_OS_OS2) || defined (P_OS_AMIGA)
	return hash_str;
#else
	if (posix) {
		/* POSIX semaphores which are named kinda like '/semname'.
		 * Some implementations of POSIX semaphores has restriction for
		 * the name as of max 14 characters, best to use this limit */
		if (P_UNLIKELY ((path_name = p_malloc0 (15)) == NULL)) {
			p_free (hash_str);
			return NULL;
		}

		strcpy (path_name, "/");
		strncat (path_name, hash_str, 13);
	} else {
		tmp_path = p_ipc_unix_get_temp_dir ();

		/* tmp dir + filename + zero symbol */
		path_name = p_malloc0 (strlen (tmp_path) + strlen (hash_str) + 1);

		if (P_UNLIKELY ((path_name) == NULL)) {
			p_free (tmp_path);
			p_free (hash_str);
			return NULL;
		}

		strcpy (path_name, tmp_path);
		strcat (path_name, hash_str);
		p_free (tmp_path);
	}

	p_free (hash_str);
	return path_name;
#endif
}